

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
SerializeMessageSet<proto2_unittest::TestAllTypes>::TestBody
          (SerializeMessageSet<proto2_unittest::TestAllTypes> *this)

{
  anon_union_32_1_493b367e_for_RawMessageSet_3 *this_00;
  bool bVar1;
  MutableType pTVar2;
  MutableType pTVar3;
  UnknownFieldSet *this_01;
  Descriptor *pDVar4;
  FieldDescriptor *pFVar5;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>_>
  *pVVar6;
  undefined8 *puVar7;
  Arena *arena;
  RepeatedField<google::protobuf::UnknownField> *this_02;
  InternalMetadata *pIVar8;
  char *pcVar9;
  char *in_R9;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  string_view value;
  AssertHelper local_120;
  AssertionResult gtest_ar__2;
  TestMessageSetExtension2 message2;
  AssertionResult gtest_ar__3;
  TestMessageSetExtension1 message1;
  AssertHelper local_98;
  RawMessageSet raw;
  string data;
  TestMessageSet message_set;
  
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet(&message_set);
  pTVar2 = proto2_wireformat_unittest::TestMessageSet::
           MutableExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension1>,(unsigned_char)11,false>
                     (&message_set,
                      (ExtensionIdentifier<proto2_wireformat_unittest::TestMessageSet,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension1>,_(unsigned_char)__v_,_false>
                       *)proto2_unittest::TestMessageSetExtension1::message_set_extension);
  (pTVar2->field_0)._impl_.i_ = 0x7b;
  *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 4;
  pTVar3 = proto2_wireformat_unittest::TestMessageSet::
           MutableExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension2>,(unsigned_char)11,false>
                     (&message_set,
                      (ExtensionIdentifier<proto2_wireformat_unittest::TestMessageSet,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestMessageSetExtension2>,_(unsigned_char)__v_,_false>
                       *)proto2_unittest::TestMessageSetExtension2::message_set_extension);
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 1;
  arena = (Arena *)(pTVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&(pTVar3->field_0)._impl_.str_,"foo",arena);
  this_01 = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                      (&message_set.super_Message.super_MessageLite._internal_metadata_);
  value._M_str = "bar";
  value._M_len = 3;
  UnknownFieldSet::AddLengthDelimited(this_01,0x17a6e7,value);
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  message1.super_Message.super_MessageLite._vptr_MessageLite._0_1_ =
       MessageLite::SerializeToString((MessageLite *)&message_set,&data);
  pIVar8 = &message1.super_Message.super_MessageLite._internal_metadata_;
  message1.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
  if (!(bool)(char)message1.super_Message.super_MessageLite._vptr_MessageLite) {
    testing::Message::Message((Message *)&message2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&raw,(internal *)&message1,
               (AssertionResult *)"message_set.SerializeToString(&data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x203,(char *)raw.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&message2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&raw);
    if ((long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                         (int32_t)message2.super_Message.super_MessageLite._vptr_MessageLite) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite.
                                     _4_4_,(int32_t)message2.super_Message.super_MessageLite.
                                                    _vptr_MessageLite) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pIVar8);
    goto LAB_007d8998;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pIVar8);
  proto2_unittest::RawMessageSet::RawMessageSet(&raw);
  data_00._M_str = data._M_dataplus._M_p;
  data_00._M_len = data._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&raw,data_00);
  pIVar8 = &message2.super_Message.super_MessageLite._internal_metadata_;
  message2.super_Message.super_MessageLite._vptr_MessageLite._0_1_ = bVar1;
  message2.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
  if (bVar1) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pIVar8);
    message2.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 0;
    if ((raw.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) == 0) {
      this_02 = (RepeatedField<google::protobuf::UnknownField> *)
                &UnknownFieldSet::default_instance()::instance;
    }
    else {
      this_02 = (RepeatedField<google::protobuf::UnknownField> *)
                ((raw.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffeU
                 ) + 8);
    }
    gtest_ar__2._0_4_ = RepeatedField<google::protobuf::UnknownField>::size(this_02);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&message1,"0","raw.unknown_fields().field_count()",(int *)&message2,
               (int *)&gtest_ar__2);
    if ((char)message1.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
      testing::Message::Message((Message *)&message2);
      if (message1.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
        pcVar9 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar9 = *(char **)message1.super_Message.super_MessageLite._internal_metadata_.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x209,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&message2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if ((long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                           (int32_t)message2.super_Message.super_MessageLite._vptr_MessageLite) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,(int32_t)message2.super_Message.super_MessageLite.
                                                      _vptr_MessageLite) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&message1.super_Message.super_MessageLite._internal_metadata_);
    message2.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = 3;
    gtest_ar__2._0_4_ = raw.field_0._impl_.item_.super_RepeatedPtrFieldBase.current_size_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&message1,"3","raw.item_size()",(int *)&message2,(int *)&gtest_ar__2);
    if ((char)message1.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
      testing::Message::Message((Message *)&message2);
      if (message1.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
        pcVar9 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar9 = *(char **)message1.super_Message.super_MessageLite._internal_metadata_.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x20b,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&message2);
      pIVar8 = &message1.super_Message.super_MessageLite._internal_metadata_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if ((long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                           (int32_t)message2.super_Message.super_MessageLite._vptr_MessageLite) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,(int32_t)message2.super_Message.super_MessageLite.
                                                      _vptr_MessageLite) + 8))();
      }
      goto LAB_007d8439;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&message1.super_Message.super_MessageLite._internal_metadata_);
    pDVar4 = proto2_unittest::TestMessageSetExtension1::GetDescriptor();
    pFVar5 = Descriptor::extension(pDVar4,0);
    message2.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = pFVar5->number_;
    this_00 = &raw.field_0;
    pVVar6 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                       ((RepeatedPtrFieldBase *)&this_00->_impl_,0);
    gtest_ar__2._0_4_ = (pVVar6->field_0)._impl_.type_id_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&message1,
               "TestFixture::TestMessageSetExtension1::descriptor() ->extension(0) ->number()",
               "raw.item(0).type_id()",(int *)&message2,(int *)&gtest_ar__2);
    if ((char)message1.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
      testing::Message::Message((Message *)&message2);
      if (message1.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
        pcVar9 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar9 = *(char **)message1.super_Message.super_MessageLite._internal_metadata_.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x20f,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&message2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if ((long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                           (int32_t)message2.super_Message.super_MessageLite._vptr_MessageLite) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,(int32_t)message2.super_Message.super_MessageLite.
                                                      _vptr_MessageLite) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&message1.super_Message.super_MessageLite._internal_metadata_);
    pDVar4 = proto2_unittest::TestMessageSetExtension2::GetDescriptor();
    pFVar5 = Descriptor::extension(pDVar4,0);
    message2.super_Message.super_MessageLite._vptr_MessageLite._0_4_ = pFVar5->number_;
    pVVar6 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                       ((RepeatedPtrFieldBase *)&this_00->_impl_,1);
    gtest_ar__2._0_4_ = (pVVar6->field_0)._impl_.type_id_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&message1,
               "TestFixture::TestMessageSetExtension2::descriptor() ->extension(0) ->number()",
               "raw.item(1).type_id()",(int *)&message2,(int *)&gtest_ar__2);
    if ((char)message1.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
      testing::Message::Message((Message *)&message2);
      if (message1.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
        pcVar9 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar9 = *(char **)message1.super_Message.super_MessageLite._internal_metadata_.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x213,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&message2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if ((long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                           (int32_t)message2.super_Message.super_MessageLite._vptr_MessageLite) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,(int32_t)message2.super_Message.super_MessageLite.
                                                      _vptr_MessageLite) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&message1.super_Message.super_MessageLite._internal_metadata_);
    pVVar6 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                       ((RepeatedPtrFieldBase *)&this_00->_impl_,2);
    message2.super_Message.super_MessageLite._vptr_MessageLite._0_4_ =
         (pVVar6->field_0)._impl_.type_id_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&message1,"kUnknownTypeId","raw.item(2).type_id()",&kUnknownTypeId,
               (int *)&message2);
    if ((char)message1.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
      testing::Message::Message((Message *)&message2);
      if (message1.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
        pcVar9 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar9 = *(char **)message1.super_Message.super_MessageLite._internal_metadata_.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x214,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&message2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      if ((long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                           (int32_t)message2.super_Message.super_MessageLite._vptr_MessageLite) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite.
                                       _4_4_,(int32_t)message2.super_Message.super_MessageLite.
                                                      _vptr_MessageLite) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&message1.super_Message.super_MessageLite._internal_metadata_);
    proto2_unittest::TestMessageSetExtension1::TestMessageSetExtension1(&message1);
    pVVar6 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                       ((RepeatedPtrFieldBase *)&this_00->_impl_,0);
    puVar7 = (undefined8 *)
             ((ulong)(pVVar6->field_0)._impl_.message_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    data_01._M_str = (char *)*puVar7;
    data_01._M_len = puVar7[1];
    bVar1 = MessageLite::ParseFromString((MessageLite *)&message1,data_01);
    gtest_ar__2.success_ = bVar1;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&message2,(internal *)&gtest_ar__2,
                 (AssertionResult *)"message1.ParseFromString(raw.item(0).message())","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x217,(char *)CONCAT44(message2.super_Message.super_MessageLite._vptr_MessageLite.
                                         _4_4_,(int32_t)message2.super_Message.super_MessageLite.
                                                        _vptr_MessageLite));
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      std::__cxx11::string::~string((string *)&message2);
      if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__2.message_);
    gtest_ar__2.success_ = true;
    gtest_ar__2._1_3_ = 0;
    gtest_ar__3._0_4_ = message1.field_0._impl_.i_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&message2,"123","message1.i()",(int *)&gtest_ar__2,(int *)&gtest_ar__3);
    if ((char)message2.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
      testing::Message::Message((Message *)&gtest_ar__2);
      if (message2.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
        pcVar9 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar9 = *(char **)message2.super_Message.super_MessageLite._internal_metadata_.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x218,pcVar9);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar__2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
      if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&message2.super_Message.super_MessageLite._internal_metadata_);
    proto2_unittest::TestMessageSetExtension2::TestMessageSetExtension2(&message2);
    pVVar6 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                       ((RepeatedPtrFieldBase *)&this_00->_impl_,1);
    puVar7 = (undefined8 *)
             ((ulong)(pVVar6->field_0)._impl_.message_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    data_02._M_str = (char *)*puVar7;
    data_02._M_len = puVar7[1];
    bVar1 = MessageLite::ParseFromString((MessageLite *)&message2,data_02);
    gtest_ar__3.success_ = bVar1;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2,(internal *)&gtest_ar__3,
                 (AssertionResult *)"message2.ParseFromString(raw.item(1).message())","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x21b,(char *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_));
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2);
      if (local_120.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_120.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__3.message_);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar__2,"\"foo\"","message2.str()",(char (*) [4])0xdd11ec,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)message2.field_0._impl_.str_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    if (gtest_ar__2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar__2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar9 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar9 = *(char **)gtest_ar__2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x21c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__2.message_);
    pVVar6 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::RawMessageSet_Item>>
                       ((RepeatedPtrFieldBase *)&this_00->_impl_,2);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar__2,"\"bar\"","raw.item(2).message()",(char (*) [4])0xf00b40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)(pVVar6->field_0)._impl_.message_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    if (gtest_ar__2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar__2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar9 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar9 = *(char **)gtest_ar__2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x21e,pcVar9);
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      if ((long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__3._4_4_,gtest_ar__3._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__2.message_);
    proto2_unittest::TestMessageSetExtension2::~TestMessageSetExtension2(&message2);
    proto2_unittest::TestMessageSetExtension1::~TestMessageSetExtension1(&message1);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&message1,(internal *)&message2,
               (AssertionResult *)"raw.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x207,(char *)CONCAT71(message1.super_Message.super_MessageLite._vptr_MessageLite.
                                       _1_7_,(char)message1.super_Message.super_MessageLite.
                                                   _vptr_MessageLite));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&message1);
    if ((long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_) + 8))();
    }
LAB_007d8439:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pIVar8);
  }
  proto2_unittest::RawMessageSet::~RawMessageSet(&raw);
LAB_007d8998:
  std::__cxx11::string::~string((string *)&data);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet(&message_set);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, SerializeMessageSet) {
  // Set up a TestMessageSet with two known messages and an unknown one.
  typename TestFixture::TestMessageSet message_set;
  message_set
      .MutableExtension(
          TestFixture::TestMessageSetExtension1::message_set_extension)
      ->set_i(123);
  message_set
      .MutableExtension(
          TestFixture::TestMessageSetExtension2::message_set_extension)
      ->set_str("foo");
  message_set.mutable_unknown_fields()->AddLengthDelimited(kUnknownTypeId,
                                                           "bar");

  std::string data;
  ASSERT_TRUE(message_set.SerializeToString(&data));

  // Parse back using RawMessageSet and check the contents.
  typename TestFixture::RawMessageSet raw;
  ASSERT_TRUE(raw.ParseFromString(data));

  EXPECT_EQ(0, raw.unknown_fields().field_count());

  ASSERT_EQ(3, raw.item_size());
  EXPECT_EQ(TestFixture::TestMessageSetExtension1::descriptor()
                ->extension(0)
                ->number(),
            raw.item(0).type_id());
  EXPECT_EQ(TestFixture::TestMessageSetExtension2::descriptor()
                ->extension(0)
                ->number(),
            raw.item(1).type_id());
  EXPECT_EQ(kUnknownTypeId, raw.item(2).type_id());

  typename TestFixture::TestMessageSetExtension1 message1;
  EXPECT_TRUE(message1.ParseFromString(raw.item(0).message()));
  EXPECT_EQ(123, message1.i());

  typename TestFixture::TestMessageSetExtension2 message2;
  EXPECT_TRUE(message2.ParseFromString(raw.item(1).message()));
  EXPECT_EQ("foo", message2.str());

  EXPECT_EQ("bar", raw.item(2).message());
}